

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbdCut2.c
# Opt level: O2

int Sbd_ManCutReduceTop(Gia_Man_t *p,Vec_Int_t *vMirrors,int iObj,Vec_Int_t *vLutLevs,
                       Vec_Int_t *vCut,Vec_Int_t *vCutTop,int nCutSize)

{
  int *piVar1;
  int iVar2;
  int v;
  uint uVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  Gia_Obj_t *pGVar7;
  long lVar8;
  ulong uVar9;
  int i;
  
  iVar2 = Vec_IntEntry(vLutLevs,iObj);
  iVar2 = iVar2 + -2;
  Vec_IntIsOrdered(vCut);
  i = vCutTop->nSize;
  do {
    do {
      do {
        if (i < 1) {
          return 0;
        }
        i = i + -1;
        v = Vec_IntEntry(vCutTop,i);
        pGVar7 = Gia_ManObj(p,v);
        uVar3 = (uint)*(undefined8 *)pGVar7;
      } while ((~uVar3 & 0x9fffffff) == 0);
      if (((int)uVar3 < 0) || ((uVar3 & 0x1fffffff) == 0x1fffffff)) {
        __assert_fail("Gia_ObjIsAnd(pObj)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/sbd/sbdCut2.c"
                      ,0x114,
                      "int Sbd_ManCutReduceTop(Gia_Man_t *, Vec_Int_t *, int, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, int)"
                     );
      }
      iVar4 = Vec_IntEntry(vLutLevs,v);
      if (iVar4 != iVar2) {
        __assert_fail("Vec_IntEntry(vLutLevs, Entry) == LevStop",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/sbd/sbdCut2.c"
                      ,0x115,
                      "int Sbd_ManCutReduceTop(Gia_Man_t *, Vec_Int_t *, int, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, int)"
                     );
      }
      iVar4 = Vec_IntEntry(vMirrors,v - (*(uint *)pGVar7 & 0x1fffffff));
      iVar5 = Vec_IntEntry(vMirrors,v - (*(uint *)&pGVar7->field_0x4 & 0x1fffffff));
      if (iVar4 < 0) {
        iVar4 = v - (*(uint *)pGVar7 & 0x1fffffff);
      }
      else {
        iVar4 = Abc_Lit2Var(iVar4);
      }
      if (iVar5 < 0) {
        iVar5 = v - (*(uint *)&pGVar7->field_0x4 & 0x1fffffff);
      }
      else {
        iVar5 = Abc_Lit2Var(iVar5);
      }
      iVar6 = Vec_IntEntry(vLutLevs,iVar4);
    } while ((iVar2 < iVar6) || (iVar6 = Vec_IntEntry(vLutLevs,iVar5), iVar2 < iVar6));
    iVar6 = Vec_IntEntry(vLutLevs,iVar4);
    if (iVar2 < iVar6) {
      __assert_fail("Vec_IntEntry(vLutLevs, Fan0) <= LevStop",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/sbd/sbdCut2.c"
                    ,0x11c,
                    "int Sbd_ManCutReduceTop(Gia_Man_t *, Vec_Int_t *, int, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, int)"
                   );
    }
    iVar6 = Vec_IntEntry(vLutLevs,iVar5);
    if (iVar2 < iVar6) {
      __assert_fail("Vec_IntEntry(vLutLevs, Fan1) <= LevStop",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/sbd/sbdCut2.c"
                    ,0x11d,
                    "int Sbd_ManCutReduceTop(Gia_Man_t *, Vec_Int_t *, int, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, int)"
                   );
    }
    iVar6 = Vec_IntEntry(vLutLevs,iVar4);
  } while ((iVar6 == iVar2) && (iVar6 = Vec_IntEntry(vLutLevs,iVar5), iVar6 == iVar2));
  uVar3 = vCut->nSize;
  uVar9 = 0;
  if (0 < (int)uVar3) {
    uVar9 = (ulong)uVar3;
  }
  for (lVar8 = 1; lVar8 - uVar9 != 1; lVar8 = lVar8 + 1) {
    piVar1 = vCut->pArray;
    if (piVar1[lVar8 + -1] == v) goto LAB_004604e6;
  }
  if ((int)uVar3 < 0) {
    __assert_fail("i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                  ,999,"int Vec_IntRemove(Vec_Int_t *, int)");
  }
LAB_0046050d:
  if (iVar4 != 0) {
    Vec_IntPushUniqueOrder(vCut,iVar4);
  }
  if (iVar5 != 0) {
    Vec_IntPushUniqueOrder(vCut,iVar5);
  }
  return 1;
LAB_004604e6:
  for (; (int)lVar8 < (int)uVar3; lVar8 = lVar8 + 1) {
    piVar1[lVar8 + -1] = piVar1[lVar8];
    uVar3 = vCut->nSize;
  }
  vCut->nSize = uVar3 - 1;
  goto LAB_0046050d;
}

Assistant:

int Sbd_ManCutReduceTop( Gia_Man_t * p, Vec_Int_t * vMirrors, int iObj, Vec_Int_t * vLutLevs, Vec_Int_t * vCut, Vec_Int_t * vCutTop, int nCutSize )
{
    int i, Entry, Lit0m, Lit1m, Fan0, Fan1;
    int LevStop = Vec_IntEntry(vLutLevs, iObj) - 2;
    Vec_IntIsOrdered( vCut );
    Vec_IntForEachEntryReverse( vCutTop, Entry, i )
    {
        Gia_Obj_t * pObj = Gia_ManObj( p, Entry );
        if ( Gia_ObjIsCi(pObj) )
            continue;
        assert( Gia_ObjIsAnd(pObj) );
        assert( Vec_IntEntry(vLutLevs, Entry) == LevStop );
        Lit0m = Vec_IntEntry( vMirrors, Gia_ObjFaninId0(pObj, Entry) );
        Lit1m = Vec_IntEntry( vMirrors, Gia_ObjFaninId1(pObj, Entry) );
        Fan0 = Lit0m >= 0 ? Abc_Lit2Var(Lit0m) : Gia_ObjFaninId0(pObj, Entry);
        Fan1 = Lit1m >= 0 ? Abc_Lit2Var(Lit1m) : Gia_ObjFaninId1(pObj, Entry);
        if ( Vec_IntEntry(vLutLevs, Fan0) > LevStop || Vec_IntEntry(vLutLevs, Fan1) > LevStop )
            continue;
        assert( Vec_IntEntry(vLutLevs, Fan0) <= LevStop );
        assert( Vec_IntEntry(vLutLevs, Fan1) <= LevStop );
        if ( Vec_IntEntry(vLutLevs, Fan0) == LevStop && Vec_IntEntry(vLutLevs, Fan1) == LevStop )
            continue;
        Vec_IntRemove( vCut, Entry );
        if ( Fan0 ) Vec_IntPushUniqueOrder( vCut, Fan0 );
        if ( Fan1 ) Vec_IntPushUniqueOrder( vCut, Fan1 );
        //Sbd_ManCutIsTopo( p, vMirrors, vCut, iObj );
        return 1;
    }
    return 0;
}